

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int request_contains_shutdown_token(http_s *request)

{
  int *piVar1;
  int iVar2;
  FIOBJ key;
  FIOBJ FVar3;
  char *__s2;
  fiobj_object_vtable_s *pfVar4;
  uintptr_t uVar5;
  uint uVar6;
  fio_str_info_s local_30;
  
  iVar2 = http_parse_body(request);
  uVar6 = 0;
  if (iVar2 == 0) {
    key = fiobj_str_new("token",5);
    uVar6 = 0;
    if ((((uint)request->params & 7) == 4) &&
       (FVar3 = fiobj_hash_get(request->params,key), FVar3 != 0)) {
      FVar3 = fiobj_hash_get(request->params,key);
      fiobj_obj2cstr(&local_30,FVar3);
      __s2 = getenv("RSHUTDOWN_TOKEN");
      iVar2 = strcmp(local_30.data,__s2);
      uVar6 = (uint)(iVar2 == 0);
    }
    if ((((~(uint)key & 6) != 0) && (key != 0)) && ((key & 1) == 0)) {
      LOCK();
      piVar1 = (int *)((key & 0xfffffffffffffff8) + 4);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pfVar4 = fiobj_type_vtable(key);
        if ((pfVar4->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)
           && (uVar5 = (*pfVar4->count)(key), uVar5 != 0)) {
          fiobj_free_complex_object(key);
          return uVar6;
        }
        pfVar4 = fiobj_type_vtable(key);
        (*pfVar4->dealloc)(key,(_func_void_FIOBJ_void_ptr *)0x0,(void *)0x0);
      }
    }
  }
  return uVar6;
}

Assistant:

int request_contains_shutdown_token(http_s *request) {
  int contains_shutdown_token = 0;

  if (http_parse_body(request) != 0) {
    return 0;
  }

  FIOBJ key = fiobj_str_new("token", 5);
  if (
    FIOBJ_TYPE_IS(request->params, FIOBJ_T_HASH)  /* check if JSON object is a hash, */
    && fiobj_hash_get(request->params, key)  /* test for existence of "token", */
    && !strcmp(fiobj_obj2cstr(fiobj_hash_get(request->params, key)).data,
        getenv("RSHUTDOWN_TOKEN"))  /* and test if token matches RSHUTDOWN_TOKEN */
  ) {
    contains_shutdown_token = 1;
  }
  fiobj_free(key);

  return contains_shutdown_token;
}